

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peter.c
# Opt level: O1

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  char *__s;
  
  if (action == 1) {
    switch(key - 0x44U >> 1 | (uint)((key - 0x44U & 1) != 0) << 0x1f) {
    case 0:
      glfwSetInputMode(window,0x33001,0x34003);
      __s = "(( cursor is disabled ))";
      break;
    default:
      return;
    case 2:
      glfwSetInputMode(window,0x33001,0x34002);
      __s = "(( cursor is hidden ))";
      break;
    case 5:
      glfwSetInputMode(window,0x33001,0x34001);
      __s = "(( cursor is normal ))";
      break;
    case 7:
      reopen = 1;
      return;
    }
    puts(__s);
    return;
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_D:
            glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_DISABLED);
            printf("(( cursor is disabled ))\n");
            break;

        case GLFW_KEY_H:
            glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_HIDDEN);
            printf("(( cursor is hidden ))\n");
            break;

        case GLFW_KEY_N:
            glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_NORMAL);
            printf("(( cursor is normal ))\n");
            break;

        case GLFW_KEY_R:
            reopen = GL_TRUE;
            break;
    }
}